

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::check_spot_timeseries_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  char *option;
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  Options *opts_00;
  long lVar4;
  ConfigManager tmpmgr;
  string local_58;
  ConfigManager local_38;
  
  bVar1 = cali::ConfigManager::Options::is_enabled((Options *)this,"timeseries");
  if (bVar1) {
    cali::ConfigManager::ConfigManager(&local_38);
    cali::ConfigManager::add_config_spec(&local_38,(ConfigInfo *)spot_timeseries_info);
    get_timeseries_config_string_abi_cxx11_(&local_58,this,opts_00);
    cali::ConfigManager::check_abi_cxx11_
              (__return_storage_ptr__,&local_38,local_58._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cali::ConfigManager::~ConfigManager(&local_38);
  }
  else {
    lVar4 = 0;
    do {
      option = *(char **)((long)&PTR_anon_var_dwarf_58c59e_00279380 + lVar4);
      bVar1 = cali::ConfigManager::Options::is_set((Options *)this,option);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,option,(allocator<char> *)&local_38);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar3 = (size_type *)(plVar2 + 2);
        if ((size_type *)*plVar2 == psVar3) {
          lVar4 = plVar2[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
        }
        __return_storage_ptr__->_M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x28);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string check_spot_timeseries_args(const cali::ConfigManager::Options& opts)
{
    if (opts.is_enabled("timeseries")) {
        // Check if the timeseries options are valid

        cali::ConfigManager tmpmgr;

        tmpmgr.add_config_spec(spot_timeseries_info);
        return tmpmgr.check(get_timeseries_config_string(opts).c_str());
    } else {
        // Warn when a timeseries option is set but timeseries is disabled

        const char* tsopts[] = { "timeseries.maxrows",
                                 "timeseries.iteration_interval",
                                 "timeseries.time_interval",
                                 "timeseries.target_loops",
                                 "timeseries.metrics" };

        for (const char* opt : tsopts)
            if (opts.is_set(opt))
                return std::string(opt) + " is set but the timeseries option is not enabled";
    }

    return "";
}